

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.h
# Opt level: O2

string * flatbuffers::ToHex<unsigned_long>
                   (string *__return_storage_ptr__,unsigned_long i,size_t width)

{
  uint *puVar1;
  ostream *poVar2;
  stringstream stream;
  long local_190 [3];
  uint auStack_178 [88];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 0x4000;
  poVar2 = std::operator<<(local_190,0x30);
  *(long *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = (long)(int)width;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return __return_storage_ptr__;
}

Assistant:

static inline std::string ToHex(T i, size_t width = sizeof(T)) {
  std::stringstream stream;
  stream << std::hex << std::uppercase << std::setfill('0')
         << std::setw(static_cast<int>(width)) << i;
  return stream.str();
}